

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_APIDestroy(hrgls_API api)

{
  API *this;
  hrgls_Status hVar1;
  
  if (api == (hrgls_API)0x0) {
    hVar1 = 0x3ec;
  }
  else {
    this = api->api;
    if (this == (API *)0x0) {
      hVar1 = 0x3ec;
    }
    else {
      hrgls::API::~API(this);
      operator_delete(this);
      api->api = (API *)0x0;
      hVar1 = 0;
    }
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::vector<hrgls_APIDataBlobSourceInfo_,_std::allocator<hrgls_APIDataBlobSourceInfo_>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::vector<hrgls_APIDataBlobSourceInfo_,_std::allocator<hrgls_APIDataBlobSourceInfo_>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::vector<hrgls_APIDataBlobSourceInfo_,_std::allocator<hrgls_APIDataBlobSourceInfo_>_>_>_>_>
    ::~_Rb_tree(&(api->latchedDataBlobSourceInfos)._M_t);
    operator_delete(api);
  }
  return hVar1;
}

Assistant:

hrgls_Status hrgls_APIDestroy(hrgls_API api)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!api) {
      s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
    } else {
      if (!api->api) {
        s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
      } else {

        try {
          delete api->api;
        } catch (...) {
          s = hrgls_STATUS_DELETION_FAILED;
        }
        api->api = nullptr;
      }
      try {
        delete api;
      } catch (...) {
        s = hrgls_STATUS_DELETION_FAILED;
      }
    }
    return s;
  }